

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

LightBounds * __thiscall
pbrt::ProjectionLight::Bounds(LightBounds *__return_storage_ptr__,ProjectionLight *this)

{
  Image *this_00;
  undefined8 uVar1;
  bool bVar2;
  long lVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  int iVar5;
  float *__result;
  float *pfVar6;
  ulong uVar7;
  long lVar8;
  Point2i p;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Float local_84 [3];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  TVar4 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  fVar10 = 0.0;
  iVar5 = TVar4.y;
  if (0 < iVar5) {
    local_68._8_8_ = local_68._0_8_;
    local_68._0_8_ = __return_storage_ptr__;
    this_00 = &this->image;
    lVar8 = 0;
    fVar10 = 0.0;
    do {
      if (0 < (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x) {
        uVar7 = 0;
        do {
          local_78._0_4_ = fVar10;
          p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(lVar8 << 0x20 | uVar7);
          local_84[0] = Image::GetChannel(this_00,p,0,(WrapMode2D)0x200000002);
          local_84[1] = Image::GetChannel(this_00,p,1,(WrapMode2D)0x200000002);
          local_84[2] = Image::GetChannel(this_00,p,2,(WrapMode2D)0x200000002);
          lVar3 = 4;
          pfVar6 = local_84;
          do {
            if (*pfVar6 < *(float *)((long)local_84 + lVar3)) {
              pfVar6 = (float *)((long)local_84 + lVar3);
            }
            lVar3 = lVar3 + 4;
          } while (lVar3 != 0xc);
          fVar10 = (float)local_78._0_4_ + *pfVar6;
          uVar7 = uVar7 + 1;
        } while ((long)uVar7 < (long)(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x);
      }
      lVar8 = lVar8 + 1;
      TVar4 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
    } while (lVar8 < (long)TVar4 >> 0x20);
    iVar5 = TVar4.y;
    __return_storage_ptr__ = (LightBounds *)local_68._0_8_;
  }
  auVar16 = ZEXT816(0) << 0x40;
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0))
                            ,auVar16,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]
                                            ));
  fVar9 = (this->super_LightBase).renderFromLight.m.m[2][2];
  auVar12 = vfmadd213ss_fma(ZEXT816(0) << 0x40,ZEXT416((uint)fVar9),auVar15);
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[3][1] * 0.0))
                            ,auVar16,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]
                                            ));
  auVar18 = vfmadd231ss_fma(auVar18,auVar16,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]));
  fVar14 = auVar18._0_4_ + (this->super_LightBase).renderFromLight.m.m[3][3];
  bVar2 = fVar14 == 1.0;
  fVar11 = auVar12._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][3];
  local_68 = ZEXT416((uint)bVar2 * (int)fVar11 + (uint)!bVar2 * (int)(fVar11 / fVar14));
  local_78._0_4_ = fVar10 * this->scale;
  fVar9 = fVar9 + auVar15._0_4_;
  auVar12 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][1]),0x10);
  auVar15._0_4_ = auVar12._0_4_ * 0.0;
  auVar15._4_4_ = auVar12._4_4_ * 0.0;
  auVar15._8_4_ = auVar12._8_4_ * 0.0;
  auVar15._12_4_ = auVar12._12_4_ * 0.0;
  auVar12 = vinsertps_avx((undefined1  [16])(this->super_LightBase).renderFromLight.m.m[0],
                          ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]),0x10);
  auVar15 = vfmadd213ps_fma(auVar12,ZEXT816(0) << 0x40,auVar15);
  auVar18 = ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]);
  auVar12 = vfmadd213ss_fma(ZEXT416(0) << 0x20,auVar18,auVar15);
  fVar10 = auVar12._0_4_ + (this->super_LightBase).renderFromLight.m.m[0][3];
  auVar12 = vmovshdup_avx(auVar15);
  auVar13 = ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]);
  auVar12 = vfmadd231ss_fma(auVar12,auVar13,auVar16);
  fVar11 = auVar12._0_4_ + (this->super_LightBase).renderFromLight.m.m[1][3];
  local_48 = vinsertps_avx(ZEXT416((uint)bVar2 * (int)fVar10 + (uint)!bVar2 * (int)(fVar10 / fVar14)
                                  ),ZEXT416((uint)bVar2 * (int)fVar11 +
                                            (uint)!bVar2 * (int)(fVar11 / fVar14)),0x10);
  auVar12 = vinsertps_avx(auVar18,auVar13,0x10);
  auVar18._0_4_ = auVar12._0_4_ + auVar15._0_4_;
  auVar18._4_4_ = auVar12._4_4_ + auVar15._4_4_;
  auVar18._8_4_ = auVar12._8_4_ + auVar15._8_4_;
  auVar18._12_4_ = auVar12._12_4_ + auVar15._12_4_;
  auVar12._0_4_ = auVar18._0_4_ * auVar18._0_4_;
  auVar12._4_4_ = auVar18._4_4_ * auVar18._4_4_;
  auVar12._8_4_ = auVar18._8_4_ * auVar18._8_4_;
  auVar12._12_4_ = auVar18._12_4_ * auVar18._12_4_;
  auVar12 = vmovshdup_avx(auVar12);
  auVar12 = vfmadd231ss_fma(auVar12,auVar18,auVar18);
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
  if (auVar12._0_4_ < 0.0) {
    local_58 = auVar18;
    fVar10 = sqrtf(auVar12._0_4_);
    auVar18 = local_58;
  }
  else {
    auVar12 = vsqrtss_avx(auVar12,auVar12);
    fVar10 = auVar12._0_4_;
  }
  fVar14 = (float)local_78._0_4_ / (float)(TVar4.x * iVar5);
  auVar16._4_4_ = fVar10;
  auVar16._0_4_ = fVar10;
  auVar16._8_4_ = fVar10;
  auVar16._12_4_ = fVar10;
  local_78 = vdivps_avx(auVar18,auVar16);
  fVar9 = fVar9 / fVar10;
  fVar10 = acosf(this->cosTotalWidth);
  uVar1 = vmovlps_avx(local_48);
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)local_68._0_4_;
  uVar1 = vmovlps_avx(local_48);
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)local_68._0_4_;
  auVar13._0_4_ = local_78._0_4_ * local_78._0_4_;
  auVar13._4_4_ = local_78._4_4_ * local_78._4_4_;
  auVar13._8_4_ = local_78._8_4_ * local_78._8_4_;
  auVar13._12_4_ = local_78._12_4_ * local_78._12_4_;
  auVar12 = vmovshdup_avx(auVar13);
  auVar12 = vfmadd231ss_fma(auVar12,local_78,local_78);
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
  if (auVar12._0_4_ < 0.0) {
    local_68._0_4_ = fVar10;
    fVar11 = sqrtf(auVar12._0_4_);
    fVar10 = (float)local_68._0_4_;
  }
  else {
    auVar12 = vsqrtss_avx(auVar12,auVar12);
    fVar11 = auVar12._0_4_;
  }
  auVar17._4_4_ = fVar11;
  auVar17._0_4_ = fVar11;
  auVar17._8_4_ = fVar11;
  auVar17._12_4_ = fVar11;
  auVar12 = vdivps_avx(local_78,auVar17);
  uVar1 = vmovlps_avx(auVar12);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = fVar9 / fVar11;
  __return_storage_ptr__->phi = fVar14;
  __return_storage_ptr__->theta_o = 0.0;
  __return_storage_ptr__->theta_e = fVar10;
  __return_storage_ptr__->cosTheta_o = 1.0;
  fVar10 = cosf(fVar10);
  __return_storage_ptr__->cosTheta_e = fVar10;
  __return_storage_ptr__->twoSided = false;
  return __return_storage_ptr__;
}

Assistant:

LightBounds ProjectionLight::Bounds() const {
#if 0
    // Along the lines of Phi()
    Float sum = 0;
    for (int v = 0; v < image.Resolution().y; ++v)
        for (int u = 0; u < image.Resolution().x; ++u) {
            Point2f ps = screenBounds.Lerp({(u + .5f) / image.Resolution().x,
                                            (v + .5f) / image.Resolution().y});
            Vector3f w = Vector3f(LightFromScreen(Point3f(ps.x, ps.y, 0)));
            w = Normalize(w);
            Float dwdA = Pow<3>(w.z);
            sum += image.GetChannels({u, v}, rgbChannelDesc).MaxValue() * dwdA;
        }
    Float phi = scale * A * sum / (image.Resolution().x * image.Resolution().y);
#else
    // See comment in SpotLight::Bounds()
    Float sum = 0;
    for (int v = 0; v < image.Resolution().y; ++v)
        for (int u = 0; u < image.Resolution().x; ++u)
            sum += std::max({image.GetChannel({u, v}, 0), image.GetChannel({u, v}, 1),
                             image.GetChannel({u, v}, 2)});
    Float phi = scale * sum / (image.Resolution().x * image.Resolution().y);
#endif
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f w = Normalize(renderFromLight(Vector3f(0, 0, 1)));
    return LightBounds(p, w, phi, 0.f, std::acos(cosTotalWidth), false);
}